

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_matrix.cc
# Opt level: O0

double * __thiscall sptk::SymmetricMatrix::At(SymmetricMatrix *this,int row,int column)

{
  out_of_range *this_00;
  reference ppdVar1;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int local_10;
  int local_c [3];
  
  local_10 = in_EDX;
  local_c[0] = in_ESI;
  if (in_ESI < in_EDX) {
    std::swap<int>(local_c,&local_10);
  }
  if ((-1 < local_10) && (local_c[0] < *(int *)(in_RDI + 8))) {
    ppdVar1 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                        ((vector<double_*,_std::allocator<double_*>_> *)(in_RDI + 0x28),
                         (long)local_c[0]);
    return *ppdVar1 + local_10;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,(anonymous_namespace)::kErrorMessageForOutOfRange);
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

double& SymmetricMatrix::At(int row, int column) {
  if (row < column) {
    std::swap(row, column);
  }
  if (column < 0 || num_dimension_ <= row) {
    throw std::out_of_range(kErrorMessageForOutOfRange);
  }
  return index_[row][column];
}